

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void cf_hash_drbg_sha256_init
               (cf_hash_drbg_sha256 *ctx,void *entropy,size_t nentropy,void *nonce,size_t nnonce,
               void *persn,size_t npersn)

{
  undefined1 local_39;
  void *pvStack_38;
  uint8_t zero;
  void *persn_local;
  size_t nnonce_local;
  void *nonce_local;
  size_t nentropy_local;
  void *entropy_local;
  cf_hash_drbg_sha256 *ctx_local;
  
  pvStack_38 = persn;
  persn_local = (void *)nnonce;
  nnonce_local = (size_t)nonce;
  nonce_local = (void *)nentropy;
  nentropy_local = (size_t)entropy;
  entropy_local = ctx;
  mem_clean(ctx,0x74);
  hash_df(&cf_sha256,(void *)nentropy_local,(size_t)nonce_local,(void *)nnonce_local,
          (size_t)persn_local,pvStack_38,npersn,(void *)0x0,0,(uint8_t *)entropy_local,0x37);
  local_39 = 0;
  hash_df(&cf_sha256,&local_39,1,entropy_local,0x37,(void *)0x0,0,(void *)0x0,0,
          (uint8_t *)((long)entropy_local + 0x37),0x37);
  *(undefined4 *)((long)entropy_local + 0x70) = 1;
  return;
}

Assistant:

void cf_hash_drbg_sha256_init(cf_hash_drbg_sha256 *ctx,
                              const void *entropy, size_t nentropy,
                              const void *nonce, size_t nnonce,
                              const void *persn, size_t npersn)
{
  mem_clean(ctx, sizeof *ctx);

  /* 1. seed_material = entropy_input || nonce || personalization_string
   * 2. seed = Hash_df(seed_material, seedlen)
   * 3. V = seed */
  hash_df(&cf_sha256,
          entropy, nentropy,
          nonce, nnonce,
          persn, npersn,
          NULL, 0,
          ctx->V, sizeof ctx->V);

  /* 4. C = Hash_df(0x00 || V, seedlen) */
  uint8_t zero = 0;
  hash_df(&cf_sha256,
          &zero, sizeof zero,
          ctx->V, sizeof ctx->V,
          NULL, 0,
          NULL, 0,
          ctx->C, sizeof ctx->C);

  /* 5. reseed_counter = 1 */
  ctx->reseed_counter = 1;
}